

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void ImGui::EndComboPreview(void)

{
  ImVec2 *pIVar1;
  float *pfVar2;
  ImDrawCmd *pIVar3;
  float fVar4;
  ImGuiWindow *pIVar5;
  ImDrawList *this;
  ImDrawCmd *pIVar6;
  ImVec2 IVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  ImGuiContext *pIVar12;
  long lVar13;
  
  pIVar12 = GImGui;
  pIVar5 = GImGui->CurrentWindow;
  fVar4 = (GImGui->ComboPreviewData).PreviewRect.Max.x;
  pIVar1 = &(pIVar5->DC).CursorMaxPos;
  if ((pIVar1->x <= fVar4 && fVar4 != pIVar1->x) &&
     (fVar4 = (GImGui->ComboPreviewData).PreviewRect.Max.y, pfVar2 = &(pIVar5->DC).CursorMaxPos.y,
     *pfVar2 <= fVar4 && fVar4 != *pfVar2)) {
    this = pIVar5->DrawList;
    lVar13 = (long)(this->CmdBuffer).Size;
    if (1 < lVar13) {
      pIVar6 = (this->CmdBuffer).Data;
      pIVar3 = pIVar6 + lVar13 + -2;
      uVar8 = (pIVar3->ClipRect).x;
      uVar9 = (pIVar3->ClipRect).y;
      uVar10 = (pIVar3->ClipRect).z;
      uVar11 = (pIVar3->ClipRect).w;
      pIVar6 = pIVar6 + lVar13 + -1;
      (pIVar6->ClipRect).x = (float)uVar8;
      (pIVar6->ClipRect).y = (float)uVar9;
      (pIVar6->ClipRect).z = (float)uVar10;
      (pIVar6->ClipRect).w = (float)uVar11;
      (this->_CmdHeader).ClipRect.x = (float)uVar8;
      (this->_CmdHeader).ClipRect.y = (float)uVar9;
      (this->_CmdHeader).ClipRect.z = (float)uVar10;
      (this->_CmdHeader).ClipRect.w = (float)uVar11;
      ImDrawList::_TryMergeDrawCmds(this);
    }
  }
  PopClipRect();
  (pIVar5->DC).CursorPos = (pIVar12->ComboPreviewData).BackupCursorPos;
  IVar7 = ImMax(&(pIVar5->DC).CursorMaxPos,&(pIVar12->ComboPreviewData).BackupCursorMaxPos);
  (pIVar5->DC).CursorMaxPos = IVar7;
  (pIVar5->DC).CursorPosPrevLine = (pIVar12->ComboPreviewData).BackupCursorPosPrevLine;
  (pIVar5->DC).PrevLineTextBaseOffset = (pIVar12->ComboPreviewData).BackupPrevLineTextBaseOffset;
  (pIVar5->DC).LayoutType = (pIVar12->ComboPreviewData).BackupLayout;
  (pIVar5->DC).IsSameLine = false;
  (pIVar12->ComboPreviewData).PreviewRect.Min.x = 0.0;
  (pIVar12->ComboPreviewData).PreviewRect.Min.y = 0.0;
  (pIVar12->ComboPreviewData).PreviewRect.Max.x = 0.0;
  (pIVar12->ComboPreviewData).PreviewRect.Max.y = 0.0;
  return;
}

Assistant:

void ImGui::EndComboPreview()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiComboPreviewData* preview_data = &g.ComboPreviewData;

    // FIXME: Using CursorMaxPos approximation instead of correct AABB which we will store in ImDrawCmd in the future
    ImDrawList* draw_list = window->DrawList;
    if (window->DC.CursorMaxPos.x < preview_data->PreviewRect.Max.x && window->DC.CursorMaxPos.y < preview_data->PreviewRect.Max.y)
        if (draw_list->CmdBuffer.Size > 1) // Unlikely case that the PushClipRect() didn't create a command
        {
            draw_list->_CmdHeader.ClipRect = draw_list->CmdBuffer[draw_list->CmdBuffer.Size - 1].ClipRect = draw_list->CmdBuffer[draw_list->CmdBuffer.Size - 2].ClipRect;
            draw_list->_TryMergeDrawCmds();
        }
    PopClipRect();
    window->DC.CursorPos = preview_data->BackupCursorPos;
    window->DC.CursorMaxPos = ImMax(window->DC.CursorMaxPos, preview_data->BackupCursorMaxPos);
    window->DC.CursorPosPrevLine = preview_data->BackupCursorPosPrevLine;
    window->DC.PrevLineTextBaseOffset = preview_data->BackupPrevLineTextBaseOffset;
    window->DC.LayoutType = preview_data->BackupLayout;
    window->DC.IsSameLine = false;
    preview_data->PreviewRect = ImRect();
}